

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Effect3d.cpp
# Opt level: O3

int __thiscall
LREffect::draw(LREffect *this,Mat *image,vector<Object,_std::allocator<Object>_> *objects)

{
  float *pfVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  ostream *poVar6;
  int iVar7;
  long lVar8;
  pointer pOVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> points;
  void *local_d8;
  Mat *pMStack_d0;
  long local_c8;
  Point_<int> local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  long local_98;
  int local_90;
  int local_8c;
  int local_88 [4];
  Mat *local_78;
  undefined8 local_70;
  ulong local_68;
  undefined8 local_60;
  undefined8 local_58;
  int local_50;
  int local_4c;
  int local_48 [3];
  int local_3c;
  int local_38 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"----Left to right effect----",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  iVar3 = *(int *)(image + 0xc) / 3;
  iVar4 = iVar3 * 2;
  pOVar9 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.super__Vector_impl_data
      ._M_finish == pOVar9) {
LAB_0011f385:
    local_c8 = 0;
    local_d8._0_4_ = 0x3010000;
    local_38[1] = 1;
    local_3c = *(int *)(image + 8) + -1;
    local_b8.x = 0;
    local_b8.y = 0x406fe000;
    uStack_b0 = 0x406fe00000000000;
    local_a8 = 0x406fe00000000000;
    uStack_a0 = 0;
    pMStack_d0 = image;
    local_48[2] = iVar3;
    local_38[0] = iVar3;
    cv::line(&local_d8,local_38,local_48 + 2,&local_b8,4,0xffffffff,0);
    local_c8 = 0;
    local_d8 = (void *)CONCAT44(local_d8._4_4_,0x3010000);
    local_48[1] = 1;
    local_4c = *(int *)(image + 8) + -1;
    local_b8.x = 0;
    local_b8.y = 0x406fe000;
    uStack_b0 = 0x406fe00000000000;
    local_a8 = 0x406fe00000000000;
    uStack_a0 = 0;
    pMStack_d0 = image;
    local_50 = iVar4;
    local_48[0] = iVar4;
    cv::line(&local_d8,local_48,&local_50,&local_b8,4,0xffffffff,0);
  }
  else {
    local_98 = (long)iVar3;
    local_68 = 0;
    uVar10 = 0;
    do {
      lVar12 = uVar10 * 0x90 + 0x14;
      while( true ) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"obj.prob ",9);
        poVar6 = std::ostream::_M_insert<double>
                           ((double)*(float *)((long)&(pOVar9->rect).x + lVar12));
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        pfVar1 = (float *)((long)&(pOVar9->rect).x + lVar12);
        if (0.5 < *pfVar1 || *pfVar1 == 0.5) break;
        uVar10 = uVar10 + 1;
        pOVar9 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar12 = lVar12 + 0x90;
        if ((ulong)(((long)(objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pOVar9 >> 4) *
                   -0x71c71c71c71c71c7) <= uVar10) {
          if ((local_68 & 1) != 0) {
            return 0;
          }
          goto LAB_0011f385;
        }
      }
      local_d8 = (void *)0x0;
      pMStack_d0 = (Mat *)0x0;
      local_c8 = 0;
      local_b8.y = 1;
      local_b8.x = iVar3;
      std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&local_d8,&local_b8);
      iVar7 = *(int *)(image + 8);
      if (0 < iVar7) {
        lVar11 = 0;
        bVar5 = false;
        lVar8 = local_98;
        do {
          cVar2 = *(char *)(lVar8 + **(long **)(&pOVar9->field_0x64 + lVar12) * lVar11 +
                                    *(long *)((long)&(pOVar9->maskdata).
                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_end_of_storage
                                             + lVar12 + 4));
          if (cVar2 == '\0') {
            if (bVar5) {
              local_b8.y = (int)lVar11;
              std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
              emplace_back<cv::Point_<int>>
                        ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&local_d8,
                         &local_b8);
              bVar5 = false;
              lVar8 = local_98;
            }
          }
          else if ((cVar2 == -1) && (!bVar5)) {
            local_b8.y = (int)lVar11;
            std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
            emplace_back<cv::Point_<int>>
                      ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&local_d8,
                       &local_b8);
            bVar5 = true;
            lVar8 = local_98;
          }
          lVar11 = lVar11 + 1;
          iVar7 = *(int *)(image + 8);
        } while (lVar11 < iVar7);
      }
      local_b8.y = iVar7 + -1;
      std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::emplace_back<cv::Point_<int>>
                ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)&local_d8,&local_b8);
      if (0 < (int)((ulong)((long)pMStack_d0 - (long)local_d8) >> 3)) {
        lVar12 = 0;
        do {
          local_70 = 0;
          local_88[2] = 0x3010000;
          local_58 = *(undefined8 *)((long)local_d8 + lVar12 * 8);
          local_60 = *(undefined8 *)((long)local_d8 + lVar12 * 8 + 8);
          local_b8.x = 0;
          local_b8.y = 0x406fe000;
          uStack_b0 = 0x406fe00000000000;
          local_a8 = 0x406fe00000000000;
          uStack_a0 = 0;
          local_78 = image;
          cv::line(local_88 + 2,&local_58,&local_60,&local_b8,4,0xffffffff,0);
          lVar12 = lVar12 + 2;
        } while ((int)lVar12 < (int)((ulong)((long)pMStack_d0 - (long)local_d8) >> 3));
      }
      local_70 = 0;
      local_88[2] = 0x3010000;
      local_88[1] = 1;
      local_8c = *(int *)(image + 8) + -1;
      local_b8.x = 0;
      local_b8.y = 0x406fe000;
      uStack_b0 = 0x406fe00000000000;
      local_a8 = 0x406fe00000000000;
      uStack_a0 = 0;
      local_90 = iVar4;
      local_88[0] = iVar4;
      local_78 = image;
      cv::line(local_88 + 2,local_88,&local_90,&local_b8,4,0xffffffff,0);
      if (local_d8 != (void *)0x0) {
        operator_delete(local_d8,local_c8 - (long)local_d8);
      }
      uVar10 = uVar10 + 1;
      pOVar9 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
               super__Vector_impl_data._M_start;
      local_68 = 0x8e38e38e38e38e01;
    } while (uVar10 < (ulong)(((long)(objects->super__Vector_base<Object,_std::allocator<Object>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pOVar9 >> 4)
                             * -0x71c71c71c71c71c7));
  }
  return 0;
}

Assistant:

int LREffect::draw(cv::Mat& image, const std::vector<Object>& objects) 
{
    std::cout << "----Left to right effect----" << std::endl;

    int left_x = image.cols/3;
    int right_x = image.cols/3*2;

    bool has_major_obj = false;

    for (size_t i = 0; i < objects.size(); i++)
    {
        const Object& obj = objects[i];
//            float ratio = obj.rect.area() / (image.rows * image.cols);
        std::cout << "obj.prob " << obj.prob << std::endl;

        if (obj.prob < 0.5 ) 
        {
            continue;
        }

        has_major_obj = true;
        // draw white line

        // left line
        std::vector<cv::Point> points;
        points.emplace_back(cv::Point(left_x, 1));
        bool is_mask = false;

        for (int y = 0; y < image.rows; y++)
        {
            const uchar* mp = obj.mask.ptr(y);
            if (mp[left_x] == 255 && !is_mask)
            {
                is_mask = true;
                points.emplace_back(cv::Point(left_x, y));
            }
            else if (mp[left_x] == 0 && is_mask)
            {
                is_mask = false;
                points.emplace_back(cv::Point(left_x, y));
            }
        }
        points.emplace_back(cv::Point(left_x, image.rows - 1));

        for (int j = 0; j < (int)points.size(); j += 2)
        {
            cv::line(image, points[j], points[j + 1], cv::Scalar(255, 255, 255), 4, -1);
        }

        // right line
        cv::line(image, cv::Point(right_x, 1), cv::Point(right_x, image.rows - 1), cv::Scalar(255,255,255), 4, -1);
    }

    if (!has_major_obj)
    {
        cv::line(image, cv::Point(left_x, 1), cv::Point(left_x, image.rows - 1),
                    cv::Scalar(255,255,255), 4, -1);
        cv::line(image, cv::Point(right_x, 1), cv::Point(right_x, image.rows - 1),
                    cv::Scalar(255,255,255), 4, -1);
    }
    return 0;
}